

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O1

uint64_t MurmurHash64B(void *key,int len,uint64_t seed)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar3 = (uint)seed ^ len;
  uVar6 = seed >> 0x20;
  if (7 < len) {
    auVar9 = vpinsrd_avx(ZEXT416(uVar3),(int)(seed >> 0x20),1);
    auVar8._8_4_ = 0x5bd1e995;
    auVar8._0_8_ = 0x5bd1e9955bd1e995;
    auVar8._12_4_ = 0x5bd1e995;
    iVar7 = len;
    do {
      auVar2 = vpmulld_avx(auVar9,auVar8);
      uVar6 = *key;
      key = (void *)((long)key + 8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar6;
      auVar9 = vpmulld_avx(auVar9,auVar8);
      auVar10 = vpsrld_avx(auVar9,0x18);
      auVar9 = vpmulld_avx(auVar10 ^ auVar9,auVar8);
      auVar9 = auVar9 ^ auVar2;
      len = iVar7 + -8;
      bVar1 = 0xf < iVar7;
      iVar7 = len;
    } while (bVar1);
    uVar6 = (ulong)auVar9._4_4_;
    uVar3 = auVar9._0_4_;
  }
  uVar5 = (uint)uVar6;
  if (3 < len) {
    uVar4 = (int)*key * 0x5bd1e995;
    key = (void *)((long)key + 4);
    uVar3 = uVar3 * 0x5bd1e995 ^ (uVar4 >> 0x18 ^ uVar4) * 0x5bd1e995;
    len = len + -4;
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_0016a594;
      uVar5 = (uint)*(byte *)((long)key + 2) << 0x10 ^ uVar5;
    }
    uVar5 = uVar5 ^ (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar6 = (ulong)(((byte)*key ^ uVar5) * 0x5bd1e995);
LAB_0016a594:
  uVar3 = ((uint)(uVar6 >> 0x12) ^ uVar3) * 0x5bd1e995;
  uVar5 = (uVar3 >> 0x16 ^ (uint)uVar6) * 0x5bd1e995;
  uVar3 = (uVar5 >> 0x11 ^ uVar3) * 0x5bd1e995;
  return CONCAT44(uVar3,(uVar3 >> 0x13 ^ uVar5) * 0x5bd1e995);
}

Assistant:

uint64_t MurmurHash64B ( const void * key, int len, uint64_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  uint32_t h1 = uint32_t(seed) ^ len;
  uint32_t h2 = uint32_t(seed >> 32);

  const uint32_t * data = (const uint32_t *)key;

  while(len >= 8)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;

    uint32_t k2 = *data++;
    k2 *= m; k2 ^= k2 >> r; k2 *= m;
    h2 *= m; h2 ^= k2;
    len -= 4;
  }

  if(len >= 4)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;
  }

  switch(len)
  {
  case 3: h2 ^= ((unsigned char*)data)[2] << 16;
  case 2: h2 ^= ((unsigned char*)data)[1] << 8;
  case 1: h2 ^= ((unsigned char*)data)[0];
      h2 *= m;
  };

  h1 ^= h2 >> 18; h1 *= m;
  h2 ^= h1 >> 22; h2 *= m;
  h1 ^= h2 >> 17; h1 *= m;
  h2 ^= h1 >> 19; h2 *= m;

  uint64_t h = h1;

  h = (h << 32) | h2;

  return h;
}